

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O2

bool __thiscall Merlin::read_dataset(Merlin *this,string *dataset)

{
  int iVar1;
  long lVar2;
  runtime_error *this_00;
  char cVar3;
  int var;
  ulong uVar4;
  size_t k;
  ulong uVar5;
  ulong uVar6;
  string err_msg;
  vector<merlin::observation,_std::allocator<merlin::observation>_> example;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<double,_std::allocator<double>_> likelihood;
  string line;
  string token;
  string str;
  istringstream in;
  byte abStack_190 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)dataset,_S_in);
  if ((abStack_190[*(long *)(_in + -0x18)] & 5) != 0) {
    std::__cxx11::string::string
              ((string *)&err_msg,"Cannot open the training dataset string",(allocator *)&line);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,(string *)&err_msg);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::vector<merlin::observation,_std::allocator<merlin::observation>_>,_std::allocator<std::vector<merlin::observation,_std::allocator<merlin::observation>_>_>_>
  ::clear(&this->m_dataset);
  merlin::split(&lines,dataset,'|');
  uVar6 = 0;
  do {
    if ((ulong)((long)lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lines);
      std::__cxx11::istringstream::~istringstream((istringstream *)&in);
      return true;
    }
    std::__cxx11::string::string
              ((string *)&line,
               (string *)
               (lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar6));
    if (line._M_string_length != 0) {
      merlin::split(&tokens,&line,',');
      example.super__Vector_base<merlin::observation,_std::allocator<merlin::observation>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      example.super__Vector_base<merlin::observation,_std::allocator<merlin::observation>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      example.super__Vector_base<merlin::observation,_std::allocator<merlin::observation>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar4 = 0;
      while( true ) {
        if ((ulong)((long)tokens.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)tokens.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar4) break;
        std::__cxx11::string::string
                  ((string *)&token,
                   (string *)
                   (tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar4));
        iVar1 = std::__cxx11::string::compare((char *)&token);
        var = (int)uVar4;
        if (iVar1 == 0) {
          err_msg._M_dataplus._M_p._4_4_ = 0xffffffff;
          err_msg._M_dataplus._M_p._0_4_ = var;
          err_msg.field_2._8_2_ = 0;
          err_msg.field_2._10_6_ = 0;
          err_msg._M_string_length = 0;
          err_msg.field_2._M_allocated_capacity._0_2_ = 0;
          err_msg.field_2._M_allocated_capacity._2_6_ = 0;
          std::vector<merlin::observation,_std::allocator<merlin::observation>_>::
          emplace_back<merlin::observation>(&example,(observation *)&err_msg);
LAB_0016496f:
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&err_msg._M_string_length);
        }
        else {
          lVar2 = std::__cxx11::string::find((char *)&token,0x179286);
          if (lVar2 == -1) {
            iVar1 = atoi(token._M_dataplus._M_p);
            err_msg._M_dataplus._M_p = (pointer)CONCAT44(iVar1,var);
            err_msg._M_string_length = 0;
            err_msg.field_2._M_allocated_capacity._0_2_ = 0;
            err_msg.field_2._M_allocated_capacity._2_6_ = 0;
            err_msg.field_2._8_2_ = 0;
            err_msg.field_2._10_6_ = 0;
            std::vector<merlin::observation,_std::allocator<merlin::observation>_>::
            emplace_back<merlin::observation>(&example,(observation *)&err_msg);
            goto LAB_0016496f;
          }
          cVar3 = (char)&token;
          std::__cxx11::string::find(cVar3,0x5b);
          std::__cxx11::string::find(cVar3,0x5d);
          std::__cxx11::string::substr((ulong)&str,(ulong)&token);
          merlin::split(&temp,&str,';');
          likelihood.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          likelihood.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          likelihood.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar2 = 0;
          for (uVar5 = 0;
              uVar5 < (ulong)((long)temp.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)temp.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar5 = uVar5 + 1) {
            err_msg._M_dataplus._M_p =
                 (pointer)atof(*(char **)((long)&((temp.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar2));
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)
                       &likelihood.super__Vector_base<double,_std::allocator<double>_>,
                       (value_type_conflict2 *)&err_msg);
            lVar2 = lVar2 + 0x20;
          }
          merlin::observation::observation
                    ((observation *)&err_msg,var,
                     (vector<double,_std::allocator<double>_> *)
                     &likelihood.super__Vector_base<double,_std::allocator<double>_>);
          std::vector<merlin::observation,_std::allocator<merlin::observation>_>::
          emplace_back<merlin::observation>(&example,(observation *)&err_msg);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&err_msg._M_string_length);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&likelihood.super__Vector_base<double,_std::allocator<double>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&temp);
          std::__cxx11::string::~string((string *)&str);
        }
        std::__cxx11::string::~string((string *)&token);
        uVar4 = uVar4 + 1;
      }
      std::
      vector<std::vector<merlin::observation,_std::allocator<merlin::observation>_>,_std::allocator<std::vector<merlin::observation,_std::allocator<merlin::observation>_>_>_>
      ::push_back(&this->m_dataset,&example);
      std::vector<merlin::observation,_std::allocator<merlin::observation>_>::~vector(&example);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
    }
    std::__cxx11::string::~string((string *)&line);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool Merlin::read_dataset(std::string dataset) {
	try {

		// Open the evidence file
		std::istringstream in(dataset);
		if (in.fail()) {
			std::string err_msg("Cannot open the training dataset string");
			throw std::runtime_error(err_msg);
		}

		// Clear any previous training dataset
		m_dataset.clear();

		// Read the training dataset string line by line
		std::vector<std::string> lines = merlin::split(dataset, '|');
		for (size_t l = 0; l < lines.size(); ++l) {
			std::string line = lines[l];
			if (line.empty()) continue; // skip empty lines
			std::vector<std::string> tokens = merlin::split(line, ',');
			std::vector<merlin::observation> example;
			for (size_t i = 0; i < tokens.size(); ++i) {
				std::string token = tokens[i];
				if (token.compare("?") == 0) { // missing value
					example.push_back(merlin::observation(i));
				} else if (token.find("[") != token.npos) { // likelihood evidence
					size_t first = token.find('[');
					size_t last = token.find(']');
					std::string str = token.substr(first+1, last-first-1);
					std::vector<std::string> temp = merlin::split(str, ';');
					std::vector<double> likelihood;
					for (size_t k = 0; k < temp.size(); ++k) {
						double d = std::atof(temp[k].c_str());
						likelihood.push_back(d);
					}
					example.push_back(merlin::observation(i, likelihood));
				} else { // regular value
					int val = std::atoi(token.c_str());
					example.push_back(merlin::observation(i, val));
				}
			}

			m_dataset.push_back(example);
		}

		return true;
	} catch (const std::runtime_error& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}